

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::dxt_hc::tile_details>::resize
          (vector<crnlib::dxt_hc::tile_details> *this,uint new_size,bool grow_hint)

{
  uint uVar1;
  uint n;
  
  uVar1 = this->m_size;
  n = uVar1 - new_size;
  if (n != 0) {
    if (uVar1 < new_size || n == 0) {
      if (this->m_capacity < new_size) {
        increase_capacity(this,new_size,uVar1 + 1 == new_size || grow_hint,false);
        uVar1 = this->m_size;
      }
      helpers::construct_array<crnlib::dxt_hc::tile_details>(this->m_p + uVar1,new_size - uVar1);
    }
    else {
      helpers::destruct_array<crnlib::dxt_hc::tile_details>(this->m_p + new_size,n);
    }
    this->m_size = new_size;
  }
  return;
}

Assistant:

inline void resize(uint new_size, bool grow_hint = false) {
    if (m_size != new_size) {
      if (new_size < m_size)
        scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
      else {
        if (new_size > m_capacity)
          increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint);

        scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
      }

      m_size = new_size;
    }
  }